

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_displacement_at
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *params,REF_DBL *displacement)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  REF_INT geom;
  REF_INT cell;
  REF_DBL clip [3];
  REF_DBL bary [3];
  REF_INT nodes [27];
  int local_fc;
  REF_GEOM local_f8;
  int local_f0;
  int local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  REF_DBL local_c8 [4];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  local_f8 = ref_facelift->grid->geom;
  *displacement = 0.0;
  displacement[1] = 0.0;
  displacement[2] = 0.0;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x280,"ref_facelift_displacement_at","requires indirect facelift");
    return 1;
  }
  if (type == 1) {
    uVar2 = ref_facelift_enclosing(ref_facelift,1,id,params,&local_f0,local_c8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x284,"ref_facelift_displacement_at",(ulong)uVar2,"enclose");
      return uVar2;
    }
    if (local_f0 == -1) {
      return 0;
    }
    local_ec = local_f0;
    uVar2 = ref_node_clip_bary2(local_c8,&local_e8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x286,"ref_facelift_displacement_at",(ulong)uVar2,"clip edge bary");
      return uVar2;
    }
    uVar2 = ref_cell_nodes(ref_facelift->edg_cell,local_ec,&local_a8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x287,"ref_facelift_displacement_at",(ulong)uVar2,"nodes");
      return uVar2;
    }
    uVar2 = ref_geom_find(local_f8,local_a8,1,id,&local_fc);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x289,"ref_facelift_displacement_at",(ulong)uVar2,"find 0");
      return uVar2;
    }
    pRVar1 = ref_facelift->displacement;
    lVar3 = (long)local_fc;
    *displacement = pRVar1[lVar3 * 3] * local_e8 + *displacement;
    displacement[1] = pRVar1[lVar3 * 3 + 1] * local_e8 + displacement[1];
    displacement[2] = local_e8 * pRVar1[lVar3 * 3 + 2] + displacement[2];
    uVar2 = ref_geom_find(local_f8,local_a4,1,id,&local_fc);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x291,"ref_facelift_displacement_at",(ulong)uVar2,"find 1");
      return uVar2;
    }
    pRVar1 = ref_facelift->displacement;
    lVar3 = (long)local_fc;
    *displacement = pRVar1[lVar3 * 3] * local_e0 + *displacement;
    displacement[1] = pRVar1[lVar3 * 3 + 1] * local_e0 + displacement[1];
    displacement[2] = local_e0 * pRVar1[lVar3 * 3 + 2] + displacement[2];
  }
  if (type == 2) {
    uVar2 = ref_facelift_enclosing(ref_facelift,2,id,params,&local_f0,local_c8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x29b,"ref_facelift_displacement_at",(ulong)uVar2,"enclose");
      return uVar2;
    }
    if (local_f0 != -1) {
      uVar2 = ref_node_clip_bary3(local_c8,&local_e8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x29d,"ref_facelift_displacement_at",(ulong)uVar2,"clip face bary");
        return uVar2;
      }
      uVar2 = ref_cell_nodes(ref_facelift->tri_cell,local_f0,&local_a8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x29e,"ref_facelift_displacement_at",(ulong)uVar2,"nodes");
        return uVar2;
      }
      uVar2 = ref_geom_find(local_f8,local_a8,2,id,&local_fc);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x2a0,"ref_facelift_displacement_at",(ulong)uVar2,"find 0");
        return uVar2;
      }
      pRVar1 = ref_facelift->displacement;
      lVar3 = (long)local_fc;
      *displacement = pRVar1[lVar3 * 3] * local_e8 + *displacement;
      displacement[1] = pRVar1[lVar3 * 3 + 1] * local_e8 + displacement[1];
      displacement[2] = local_e8 * pRVar1[lVar3 * 3 + 2] + displacement[2];
      uVar2 = ref_geom_find(local_f8,local_a4,2,id,&local_fc);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x2a8,"ref_facelift_displacement_at",(ulong)uVar2,"find 1");
        return uVar2;
      }
      pRVar1 = ref_facelift->displacement;
      lVar3 = (long)local_fc;
      *displacement = pRVar1[lVar3 * 3] * local_e0 + *displacement;
      displacement[1] = pRVar1[lVar3 * 3 + 1] * local_e0 + displacement[1];
      displacement[2] = local_e0 * pRVar1[lVar3 * 3 + 2] + displacement[2];
      uVar2 = ref_geom_find(local_f8,local_a0,2,id,&local_fc);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x2b0,"ref_facelift_displacement_at",(ulong)uVar2,"find 2");
        return uVar2;
      }
      pRVar1 = ref_facelift->displacement;
      lVar3 = (long)local_fc;
      *displacement = pRVar1[lVar3 * 3] * local_d8 + *displacement;
      displacement[1] = pRVar1[lVar3 * 3 + 1] * local_d8 + displacement[1];
      displacement[2] = local_d8 * pRVar1[lVar3 * 3 + 2] + displacement[2];
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_displacement_at(
    REF_FACELIFT ref_facelift, REF_INT type, REF_INT id, REF_DBL *params,
    REF_DBL *displacement) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL bary[3], clip[3];
  displacement[0] = 0.0;
  displacement[1] = 0.0;
  displacement[2] = 0.0;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  if (REF_GEOM_EDGE == type) {
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    if (REF_EMPTY == cell) return REF_SUCCESS;
    RSS(ref_node_clip_bary2(bary, clip), "clip edge bary");
    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), cell, nodes), "nodes");

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_EDGE, id, &geom), "find 0");
    displacement[0] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 2, geom);

    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_EDGE, id, &geom), "find 1");
    displacement[0] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 2, geom);
  }
  if (REF_GEOM_FACE == type) {
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    if (REF_EMPTY == cell) return REF_SUCCESS;
    RSS(ref_node_clip_bary3(bary, clip), "clip face bary");
    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cell, nodes), "nodes");

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, id, &geom), "find 0");
    displacement[0] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 2, geom);

    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, id, &geom), "find 1");
    displacement[0] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 2, geom);

    RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, id, &geom), "find 2");
    displacement[0] +=
        clip[2] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[2] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[2] * ref_facelift_displacement(ref_facelift, 2, geom);
  }

  return REF_SUCCESS;
}